

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionContext.h
# Opt level: O0

StackFrame * __thiscall
Js::JavascriptExceptionContext::StackFrame::operator=(StackFrame *this,StackFrame *other)

{
  StackFrame *other_local;
  StackFrame *this_local;
  
  Memory::WriteBarrierPtr<Js::FunctionBody>::operator=(&this->functionBody,&other->functionBody);
  Memory::WriteBarrierPtr<const_char16_t>::operator=(&(this->field_1).name,&(other->field_1).name);
  (this->argumentTypes).types = (other->argumentTypes).types;
  return this;
}

Assistant:

StackFrame& operator=(const StackFrame& other)
            {
                functionBody = other.functionBody;
                name = other.name;
                argumentTypes = other.argumentTypes;
                return *this;
            }